

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsData.cpp
# Opt level: O2

void helicsDataBufferToString
               (HelicsDataBuffer data,char *outputString,int maxStringLen,int *actualLength)

{
  bool bVar1;
  DataType baseType;
  SmallBuffer *pSVar2;
  int iVar3;
  string v;
  data_view local_68;
  string local_48;
  
  if ((outputString != (char *)0x0 && 0 < maxStringLen) &&
     (pSVar2 = getBuffer(data), pSVar2 != (SmallBuffer *)0x0)) {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    local_48._M_string_length = 0;
    local_48.field_2._M_local_buf[0] = '\0';
    local_68.dblock._M_len = pSVar2->bufferSize;
    local_68.dblock._M_str = (char *)pSVar2->heap;
    local_68.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_68.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    baseType = helics::detail::detectType((byte *)local_68.dblock._M_str);
    helics::valueExtract(&local_68,baseType,&local_48);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_68.ref.
                super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    iVar3 = maxStringLen;
    if ((int)local_48._M_string_length < maxStringLen) {
      iVar3 = (int)local_48._M_string_length;
    }
    bVar1 = maxStringLen <= (int)local_48._M_string_length;
    memcpy(outputString,local_48._M_dataplus._M_p,(long)iVar3);
    iVar3 = iVar3 - (uint)bVar1;
    outputString[iVar3] = '\0';
    if (actualLength != (int *)0x0) {
      *actualLength = iVar3;
    }
    std::__cxx11::string::~string((string *)&local_48);
    return;
  }
  if (actualLength != (int *)0x0) {
    *actualLength = 0;
  }
  return;
}

Assistant:

void helicsDataBufferToString(HelicsDataBuffer data, char* outputString, int maxStringLen, int* actualLength)
{
    if ((outputString == nullptr) || (maxStringLen <= 0)) {
        if (actualLength != nullptr) {
            *actualLength = 0;
        }
        return;
    }
    auto* ptr = getBuffer(data);
    if (ptr == nullptr) {
        if (actualLength != nullptr) {
            *actualLength = 0;
        }
        return;
    }
    std::string v;
    helics::valueExtract(helics::data_view(*ptr), helics::detail::detectType(ptr->data()), v);

    auto length = (std::min)(static_cast<int>(v.size()), maxStringLen);
    std::memcpy(outputString, v.data(), length);

    // add a null terminator
    if (length >= maxStringLen) {
        --length;
    }
    outputString[length] = '\0';
    if (actualLength != nullptr) {
        *actualLength = length;
    }
}